

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O2

set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
* anon_unknown.dwarf_9a1342::FindChallenges
            (set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
             *__return_storage_ptr__,NodeRef *ref)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  pointer pCVar3;
  pointer psVar4;
  _Base_ptr p_Var5;
  undefined1 auVar6 [16];
  bool bVar7;
  _Base_ptr p_Var8;
  _Alloc_node *in_R8;
  CPubKey *key;
  pointer pCVar9;
  pointer ref_00;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar10;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  sub_chal;
  uint local_6c;
  set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar2 = (ref->super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pCVar3 = (peVar2->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar9 = (peVar2->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar9 != pCVar3; pCVar9 = pCVar9 + 1) {
    local_68._M_t._M_impl._0_4_ = 6;
    local_6c = *(uint *)(pCVar9->vch + 0x1d);
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&local_6c);
  }
  peVar2 = (ref->super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  switch(peVar2->fragment) {
  case OLDER:
    local_68._M_t._M_impl._0_4_ = 4;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int_const&>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&peVar2->k);
    break;
  case AFTER:
    local_68._M_t._M_impl._0_4_ = 5;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int_const&>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&peVar2->k);
    break;
  case SHA256:
    local_68._M_t._M_impl._0_4_ = 0;
    local_6c = *(uint *)(peVar2->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&local_6c);
    break;
  case HASH256:
    local_68._M_t._M_impl._0_4_ = 2;
    local_6c = *(uint *)(peVar2->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&local_6c);
    break;
  case RIPEMD160:
    local_68._M_t._M_impl._0_4_ = 1;
    local_6c = *(uint *)(peVar2->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&local_6c);
    break;
  case HASH160:
    local_68._M_t._M_impl._0_4_ = 3;
    local_6c = *(uint *)(peVar2->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
    ::emplace<(anonymous_namespace)::ChallengeType,unsigned_int>
              ((set<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                *)__return_storage_ptr__,(ChallengeType *)&local_68,&local_6c);
  }
  peVar2 = (ref->super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  ref_00 = (peVar2->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (peVar2->subs).
           super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ref_00 == psVar4) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    FindChallenges(&local_68,ref_00);
    for (p_Var8 = local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &local_68._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      if ((__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_003bacd0:
        pVar10 = std::
                 _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
                 ::_M_get_insert_unique_pos(&__return_storage_ptr__->_M_t,(key_type *)(p_Var8 + 1));
        if (pVar10.second != (_Rb_tree_node_base *)0x0) goto LAB_003bace3;
      }
      else {
        p_Var5 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
        bVar7 = (int)p_Var5[1]._M_color < (int)p_Var8[1]._M_color;
        if (p_Var5[1]._M_color == p_Var8[1]._M_color) {
          bVar7 = *(uint *)&p_Var5[1].field_0x4 < *(uint *)&p_Var8[1].field_0x4;
        }
        if (!bVar7) goto LAB_003bacd0;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = p_Var5;
        pVar10 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar6 << 0x40);
LAB_003bace3:
        std::
        _Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
        ::
        _M_insert_<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>const&,std::_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>::_Alloc_node>
                  ((_Rb_tree<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>,std::_Identity<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::less<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>,std::allocator<std::pair<(anonymous_namespace)::ChallengeType,unsigned_int>>>
                    *)__return_storage_ptr__,pVar10.first,pVar10.second,
                   (pair<(anonymous_namespace)::ChallengeType,_unsigned_int> *)(p_Var8 + 1),in_R8);
      }
    }
    std::
    set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
    ::~set(&local_68);
    ref_00 = ref_00 + 1;
  } while( true );
}

Assistant:

std::set<Challenge> FindChallenges(const NodeRef& ref) {
    std::set<Challenge> chal;
    for (const auto& key : ref->keys) {
        chal.emplace(ChallengeType::PK, ChallengeNumber(key));
    }
    if (ref->fragment == miniscript::Fragment::OLDER) {
        chal.emplace(ChallengeType::OLDER, ref->k);
    } else if (ref->fragment == miniscript::Fragment::AFTER) {
        chal.emplace(ChallengeType::AFTER, ref->k);
    } else if (ref->fragment == miniscript::Fragment::SHA256) {
        chal.emplace(ChallengeType::SHA256, ChallengeNumber(ref->data));
    } else if (ref->fragment == miniscript::Fragment::RIPEMD160) {
        chal.emplace(ChallengeType::RIPEMD160, ChallengeNumber(ref->data));
    } else if (ref->fragment == miniscript::Fragment::HASH256) {
        chal.emplace(ChallengeType::HASH256, ChallengeNumber(ref->data));
    } else if (ref->fragment == miniscript::Fragment::HASH160) {
        chal.emplace(ChallengeType::HASH160, ChallengeNumber(ref->data));
    }
    for (const auto& sub : ref->subs) {
        auto sub_chal = FindChallenges(sub);
        chal.insert(sub_chal.begin(), sub_chal.end());
    }
    return chal;
}